

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

SIMDShift * __thiscall
wasm::Builder::makeSIMDShift(Builder *this,SIMDShiftOp op,Expression *vec,Expression *shift)

{
  SIMDShift *this_00;
  
  this_00 = MixedArena::alloc<wasm::SIMDShift>(&this->wasm->allocator);
  this_00->op = op;
  this_00->vec = vec;
  this_00->shift = shift;
  SIMDShift::finalize(this_00);
  return this_00;
}

Assistant:

SIMDShift* makeSIMDShift(SIMDShiftOp op, Expression* vec, Expression* shift) {
    auto* ret = wasm.allocator.alloc<SIMDShift>();
    ret->op = op;
    ret->vec = vec;
    ret->shift = shift;
    ret->finalize();
    return ret;
  }